

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::AssetPath>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *result)

{
  bool bVar1;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  AssetPath value_1;
  int local_90;
  char nc;
  char c;
  string local_88;
  undefined1 local_68 [8];
  AssetPath value;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value.resolved_path_.field_2._8_8_ = result;
  ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::clear
            (result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    tinyusdz::value::AssetPath::AssetPath((AssetPath *)local_68);
    bVar1 = ReadBasicType(this,(AssetPath *)local_68);
    if (bVar1) {
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      push_back((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                value.resolved_path_.field_2._8_8_,(value_type *)local_68);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_88,"Not starting with the value of requested type.\n",
                 (allocator *)&c);
      PushError(this,&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::allocator<char>::~allocator((allocator<char> *)&c);
      this_local._7_1_ = 0;
    }
    tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_68);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005a2f0a;
        }
        bVar1 = Char1(this,value_1.resolved_path_.field_2._M_local_buf + 0xf);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005a2f0a;
        }
        if (value_1.resolved_path_.field_2._M_local_buf[0xf] == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005a2f0a;
          }
          bVar1 = LookChar1(this,value_1.resolved_path_.field_2._M_local_buf + 0xe);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005a2f0a;
          }
          if (value_1.resolved_path_.field_2._M_local_buf[0xe] == end_symbol) break;
        }
        if (value_1.resolved_path_.field_2._M_local_buf[0xf] != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005a2f0a;
        }
        tinyusdz::value::AssetPath::AssetPath((AssetPath *)local_d8);
        bVar1 = ReadBasicType(this,(AssetPath *)local_d8);
        if (bVar1) {
          ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
          push_back((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                     *)value.resolved_path_.field_2._8_8_,(value_type *)local_d8);
          local_90 = 0;
        }
        else {
          local_90 = 3;
        }
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_d8);
      } while (local_90 == 0);
      bVar1 = ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
              ::empty((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                       *)value.resolved_path_.field_2._8_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_f8,"Empty array.\n",&local_f9);
        PushError(this,&local_f8);
        ::std::__cxx11::string::~string((string *)&local_f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005a2f0a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}